

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

string * __thiscall
pbrt::Interaction::ToString_abi_cxx11_(string *__return_storage_ptr__,Interaction *this)

{
  MediumInterface *this_00;
  long lVar1;
  char **in_stack_ffffffffffffff80;
  char *local_78;
  string local_70;
  char *local_50;
  string local_48;
  
  lVar1 = (this->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits << 0x10;
  local_78 = "(nullptr)";
  if (lVar1 != 0) {
    in_stack_ffffffffffffff80 = (char **)0x4e2408;
    MediumHandle::ToString_abi_cxx11_(&local_48,&this->medium);
    local_78 = local_48._M_dataplus._M_p;
  }
  this_00 = this->mediumInterface;
  local_50 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    in_stack_ffffffffffffff80 = (char **)0x4e2425;
    MediumInterface::ToString_abi_cxx11_(&local_70,this_00);
    local_50 = local_70._M_dataplus._M_p;
  }
  StringPrintf<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*>
            (__return_storage_ptr__,
             (pbrt *)
             "[ Interaction pi: %s n: %s uv: %s wo: %s time: %s medium: %s mediumInterface: %s ]",
             (char *)this,(Point3fi *)&this->n,(Normal3<float> *)&this->uv,
             (Point2<float> *)&this->wo,(Vector3<float> *)&this->time,(float *)&local_78,&local_50,
             in_stack_ffffffffffffff80);
  if (this_00 != (MediumInterface *)0x0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (lVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interaction::ToString() const {
    return StringPrintf(
        "[ Interaction pi: %s n: %s uv: %s wo: %s time: %s "
        "medium: %s mediumInterface: %s ]",
        pi, n, uv, wo, time, medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)");
}